

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

arth * gen_loadi(compiler_state_t *cstate,int val)

{
  int iVar1;
  arth *paVar2;
  slist *psVar3;
  slist *psVar4;
  
  paVar2 = (arth *)newchunk(cstate,0x18);
  iVar1 = alloc_reg(cstate);
  psVar3 = (slist *)newchunk(cstate,0x28);
  (psVar3->s).code = 0;
  (psVar3->s).k = val;
  psVar4 = (slist *)newchunk(cstate,0x28);
  (psVar4->s).code = 2;
  psVar3->next = psVar4;
  (psVar4->s).k = iVar1;
  paVar2->s = psVar3;
  paVar2->regno = iVar1;
  return paVar2;
}

Assistant:

struct arth *
gen_loadi(compiler_state_t *cstate, int val)
{
	struct arth *a;
	struct slist *s;
	int reg;

	a = (struct arth *)newchunk(cstate, sizeof(*a));

	reg = alloc_reg(cstate);

	s = new_stmt(cstate, BPF_LD|BPF_IMM);
	s->s.k = val;
	s->next = new_stmt(cstate, BPF_ST);
	s->next->s.k = reg;
	a->s = s;
	a->regno = reg;

	return a;
}